

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O2

void dismount_steed(int reason)

{
  permonst *ppVar1;
  uint uVar2;
  monst *mtmp;
  boolean bVar3;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  undefined8 in_RAX;
  obj *poVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  coord cc;
  
  uVar2 = u.utrap;
  cc = SUB82((ulong)in_RAX >> 0x30,0);
  bVar3 = landing_spot(&cc,reason,0);
  mtmp = u.usteed;
  if (u.usteed == (monst *)0x0) {
    return;
  }
  poVar7 = which_armor(u.usteed,0x100000);
  switch(reason) {
  case 0:
  case 4:
  case 5:
    break;
  case 1:
    pcVar8 = "fall";
    goto LAB_00246780;
  case 2:
    pcVar8 = "are thrown";
LAB_00246780:
    pcVar9 = mon_nam(mtmp);
    pline("You %s off of %s!",pcVar8,pcVar9);
    bVar10 = bVar3 == '\0';
    bVar3 = '\x01';
    if (bVar10) {
      bVar3 = landing_spot(&cc,reason,1);
    }
    uVar5 = mt_random();
    losehp(uVar5 % 10 + 10,"riding accident",0);
    uVar5 = u.uprops[0x20].intrinsic;
    uVar6 = mt_random();
    set_wounded_legs(0x60000,uVar6 % 5 + uVar5 + 5);
    goto LAB_00246809;
  case 3:
    pcVar8 = mon_nam(u.usteed);
    pline("You can no longer ride %s.",pcVar8);
    bVar10 = bVar3 == '\0';
    bVar3 = '\x01';
    if (bVar10) {
      bVar3 = landing_spot(&cc,3,1);
    }
    break;
  default:
    if ((poVar7 != (obj *)0x0) && ((*(uint *)&poVar7->field_0x4a & 1) != 0)) {
      pcVar8 = "is";
      if ((*(uint *)&poVar7->field_0x4a & 0x40) == 0) {
        pcVar8 = "seems to be";
      }
      pline("You can\'t.  The saddle %s cursed.",pcVar8);
      poVar7->field_0x4a = poVar7->field_0x4a | 0x40;
      return;
    }
    if (bVar3 == '\0') {
      pline("You can\'t. There isn\'t anywhere for you to stand.");
      return;
    }
    if (mtmp->mnamelth == '\0') {
      pcVar8 = mons_mname(mtmp->data);
      pcVar8 = an(pcVar8);
      pline("You\'ve been through the dungeon on %s with no name.",pcVar8);
      bVar3 = '\x01';
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar4 = dmgtype(youmonst.data,0x24), bVar4 == '\0')))) {
        pline("It felt good to get out of the rain.");
      }
    }
    else {
      pcVar8 = mon_nam(mtmp);
      pline("You dismount %s.",pcVar8);
      bVar3 = '\x01';
    }
  }
  u.uprops[0x20].extrinsic = 0;
  u.uprops[0x20].intrinsic = 0;
  u.usteed = (monst *)0x0;
  u.ugallop = 0;
  if (reason == 5) {
    bVar3 = enexto(&cc,level,u.ux,u.uy,mtmp->data);
    if (bVar3 != '\0') {
      rloc_to(mtmp,level,(int)cc.x,(int)cc.y);
      return;
    }
    rloc(level,mtmp,'\0');
    return;
  }
LAB_00246809:
  u.ugallop = 0;
  u.usteed = (monst *)0x0;
  if (mtmp->mhp < 1) goto LAB_00246a95;
  place_monster(mtmp,(int)u.ux,(int)u.uy);
  if ((((u._1052_1_ & 1) != 0) || (u.ustuck != (monst *)0x0)) || (bVar3 == '\0')) {
    bVar3 = enexto(&cc,level,u.ux,u.uy,mtmp->data);
    if (bVar3 == '\0') {
      killed(mtmp);
      adjalign(-1);
    }
    else {
      rloc_to(mtmp,level,(int)cc.x,(int)cc.y);
    }
    goto LAB_00246a95;
  }
  ppVar1 = mtmp->data;
  if ((((ppVar1->mflags1 & 1) == 0) && ((ppVar1->mflags1 & 0x10) == 0)) && (ppVar1->mlet != '\x05'))
  {
    bVar3 = is_pool(level,(int)u.ux,(int)u.uy);
    if (bVar3 == '\0') {
      bVar3 = is_lava(level,(int)u.ux,(int)u.uy);
      if (bVar3 != '\0') {
        pcVar8 = Monnam(mtmp);
        pline("%s is pulled into the lava!",pcVar8);
        if (ppVar1 != mons + 0x157 && ppVar1 != mons + 0xa0) goto LAB_00246a50;
      }
    }
    else {
      if ((u._1052_1_ & 2) == 0) {
        pcVar8 = Monnam(mtmp);
        pcVar9 = surface((int)u.ux,(int)u.uy);
        pline("%s falls into the %s!",pcVar8,pcVar9);
      }
      if ((ppVar1->mflags1 & 0x602) == 0) {
LAB_00246a50:
        killed(mtmp);
        adjalign(-1);
      }
    }
  }
  if (0 < mtmp->mhp) {
    in_steed_dismounting = '\x01';
    teleds((int)cc.x,(int)cc.y,'\x01');
    in_steed_dismounting = '\0';
    if (uVar2 != 0) {
      mintrap(mtmp);
    }
  }
LAB_00246a95:
  if (reason == 4) {
    iflags.botl = '\x01';
  }
  else {
    in_steed_dismounting = '\x01';
    float_down(0,0x100000);
    in_steed_dismounting = '\0';
    iflags.botl = '\x01';
    encumber_msg();
    vision_full_recalc = '\x01';
  }
  return;
}

Assistant:

void dismount_steed(int reason)
{
	struct monst *mtmp;
	struct obj *otmp;
	coord cc;
	const char *verb = "fall";
	boolean repair_leg_damage = TRUE;
	unsigned save_utrap = u.utrap;
	boolean have_spot = landing_spot(&cc,reason,0);
	
	mtmp = u.usteed;		/* make a copy of steed pointer */
	/* Sanity check */
	if (!mtmp)		/* Just return silently */
	    return;

	/* Check the reason for dismounting */
	otmp = which_armor(mtmp, W_SADDLE);
	switch (reason) {
	    case DISMOUNT_THROWN:
		verb = "are thrown";
	    case DISMOUNT_FELL:
		pline("You %s off of %s!", verb, mon_nam(mtmp));
		if (!have_spot) have_spot = landing_spot(&cc,reason,1);
		losehp(rn1(10,10), "riding accident", KILLED_BY_AN);
		set_wounded_legs(BOTH_SIDES, (int)HWounded_legs + rn1(5,5));
		repair_leg_damage = FALSE;
		break;
	    case DISMOUNT_POLY:
		pline("You can no longer ride %s.", mon_nam(u.usteed));
		if (!have_spot) have_spot = landing_spot(&cc,reason,1);
		break;
	    case DISMOUNT_ENGULFED:
		/* caller displays message */
		break;
	    case DISMOUNT_BONES:
		/* hero has just died... */
		break;
	    case DISMOUNT_GENERIC:
		/* no messages, just make it so */
		break;
	    case DISMOUNT_BYCHOICE:
	    default:
		if (otmp && otmp->cursed) {
		    pline("You can't.  The saddle %s cursed.",
			otmp->bknown ? "is" : "seems to be");
		    otmp->bknown = TRUE;
		    return;
		}
		if (!have_spot) {
		    pline("You can't. There isn't anywhere for you to stand.");
		    return;
		}
		if (!mtmp->mnamelth) {
			pline("You've been through the dungeon on %s with no name.",
				an(mons_mname(mtmp->data)));
			if (Hallucination)
				pline("It felt good to get out of the rain.");
		} else
			pline("You dismount %s.", mon_nam(mtmp));
	}
	/* While riding these refer to the steed's legs
	 * so after dismounting they refer to the player's
	 * legs once again.
	 */
	if (repair_leg_damage) HWounded_legs = EWounded_legs = 0;

	/* Release the steed and saddle */
	u.usteed = 0;
	u.ugallop = 0L;

	/* Set player and steed's position.  Try moving the player first
	   unless we're in the midst of creating a bones file. */
	if (reason == DISMOUNT_BONES) {
	    /* move the steed to an adjacent square */
	    if (enexto(&cc, level, u.ux, u.uy, mtmp->data))
		rloc_to(mtmp, level, cc.x, cc.y);
	    else	/* evidently no room nearby; move steed elsewhere */
		rloc(level, mtmp, FALSE);
	    return;
	}
	if (!DEADMONSTER(mtmp)) {
	    place_monster(mtmp, u.ux, u.uy);
	    if (!u.uswallow && !u.ustuck && have_spot) {
		const struct permonst *mdat = mtmp->data;

		/* The steed may drop into water/lava */
		if (!is_flyer(mdat) && !is_floater(mdat) && !is_clinger(mdat)) {
		    if (is_pool(level, u.ux, u.uy)) {
			if (!Underwater)
			    pline("%s falls into the %s!", Monnam(mtmp),
							surface(u.ux, u.uy));
			if (!is_swimmer(mdat) && !amphibious(mdat)) {
			    killed(mtmp);
			    adjalign(-1);
			}
		    } else if (is_lava(level, u.ux, u.uy)) {
			pline("%s is pulled into the lava!", Monnam(mtmp));
			if (!likes_lava(mdat)) {
			    killed(mtmp);
			    adjalign(-1);
			}
		    }
		}
	    /* Steed dismounting consists of two steps: being moved to another
	     * square, and descending to the floor.  We have functions to do
	     * each of these activities, but they're normally called
	     * individually and include an attempt to look at or pick up the
	     * objects on the floor:
	     * teleds() --> spoteffects() --> pickup()
	     * float_down() --> pickup()
	     * We use this kludge to make sure there is only one such attempt.
	     *
	     * Clearly this is not the best way to do it.  A full fix would
	     * involve having these functions not call pickup() at all, instead
	     * calling them first and calling pickup() afterwards.  But it
	     * would take a lot of work to keep this change from having any
	     * unforseen side effects (for instance, you would no longer be
	     * able to walk onto a square with a hole, and autopickup before
	     * falling into the hole).
	     */
		/* [ALI] No need to move the player if the steed died. */
		if (!DEADMONSTER(mtmp)) {
		    /* Keep steed here, move the player to cc;
		     * teleds() clears u.utrap
		     */
		    in_steed_dismounting = TRUE;
		    teleds(cc.x, cc.y, TRUE);
		    in_steed_dismounting = FALSE;

		    /* Put your steed in your trap */
		    if (save_utrap)
			mintrap(mtmp);
		}
	    /* Couldn't... try placing the steed */
	    } else if (enexto(&cc, level, u.ux, u.uy, mtmp->data)) {
		/* Keep player here, move the steed to cc */
		rloc_to(mtmp, level, cc.x, cc.y);
		/* Player stays put */
	    /* Otherwise, kill the steed */
	    } else {
		killed(mtmp);
		adjalign(-1);
	    }
	}

	/* Return the player to the floor */
	if (reason != DISMOUNT_ENGULFED) {
	    in_steed_dismounting = TRUE;
	    float_down(0L, W_SADDLE);
	    in_steed_dismounting = FALSE;
	    iflags.botl = 1;
	    encumber_msg();
	    vision_full_recalc = 1;
	} else {
	    iflags.botl = 1;
	}

	return;
}